

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O1

void emit_rma(ASMState *as,x86Op xo,Reg rr,void *addr)

{
  MCode *pMVar1;
  byte *pbVar2;
  int iVar3;
  lua_State **pplVar4;
  uint uVar5;
  long lVar6;
  Reg RVar7;
  MCode MVar8;
  byte bVar9;
  
  pplVar4 = &as->J[1].L;
  lVar6 = (long)addr - (long)pplVar4;
  if ((int)lVar6 == lVar6) {
    RVar7 = 0xe;
  }
  else {
    pMVar1 = as->mcp;
    lVar6 = (long)addr - (long)pMVar1;
    if (((int)lVar6 != lVar6) || ((ulong)((long)addr + (0x80000000 - (long)as->mctop)) >> 0x20 != 0)
       ) {
      if ((void *)(long)(int)addr == addr) {
        *(int *)(pMVar1 + -4) = (int)addr;
        pMVar1[-5] = '%';
        pMVar1[-6] = (char)rr * '\b' & 0x38U | 4;
        iVar3 = xo << 0x18;
        if (iVar3 == -0x3c000000) {
          *(x86Op *)(pMVar1 + -10) = (rr & 8) << 0xc ^ xo;
          pbVar2 = pMVar1 + -10;
        }
        else {
          *(x86Op *)(pMVar1 + -10) = xo;
          lVar6 = (long)(iVar3 >> 0x18);
          pbVar2 = pMVar1 + lVar6 + -5;
          uVar5 = rr >> 1 & 0x104;
          if (uVar5 != 0) {
            bVar9 = (byte)(rr >> 0x10) | (byte)uVar5 | 0x40;
            if (iVar3 == -0x4000000) {
              *pbVar2 = bVar9;
              bVar9 = (byte)(xo >> 8);
            }
            else if ((xo & 0xffffff) == 0x6600fd) {
              *pbVar2 = bVar9;
              bVar9 = 0x66;
            }
            pMVar1[lVar6 + -6] = bVar9;
            pbVar2 = pMVar1 + lVar6 + -6;
          }
        }
        as->mcp = pbVar2;
        return;
      }
      if (xo == XO_MOV) {
        RVar7 = rr & 0xf;
      }
      else {
        if (xo == XO_GROUP3b) {
          as->mcp = pMVar1 + 1;
          MVar8 = *pMVar1;
        }
        else {
          MVar8 = '\0';
        }
        if ((ulong)pplVar4 >> 0x20 == 0) {
          emit_loadi(as,0xe,(int32_t)pplVar4);
        }
        else {
          pMVar1 = as->mcp;
          *(lua_State ***)(pMVar1 + -8) = pplVar4;
          pMVar1[-10] = 'I';
          pMVar1[-9] = 0xbe;
          as->mcp = pMVar1 + -10;
        }
        RVar7 = 0xe;
        if (xo == XO_GROUP3b) {
          pMVar1 = as->mcp;
          as->mcp = pMVar1 + -1;
          pMVar1[-1] = MVar8;
        }
      }
      emit_rmro(as,xo,rr,RVar7,0);
      emit_loadu64(as,RVar7,(uint64_t)addr);
      return;
    }
    RVar7 = 0x25;
  }
  emit_rmro(as,xo,rr,RVar7,(int32_t)lVar6);
  return;
}

Assistant:

static void emit_rma(ASMState *as, x86Op xo, Reg rr, const void *addr)
{
#if LJ_GC64
  if (checki32(dispofs(as, addr))) {
    emit_rmro(as, xo, rr, RID_DISPATCH, (int32_t)dispofs(as, addr));
  } else if (checki32(mcpofs(as, addr)) && checki32(mctopofs(as, addr))) {
    emit_rmro(as, xo, rr, RID_RIP, (int32_t)mcpofs(as, addr));
  } else if (!checki32((intptr_t)addr)) {
    Reg ra = (rr & 15);
    if (xo != XO_MOV) {
      /* We can't allocate a register here. Use and restore DISPATCH. Ugly. */
      uint64_t dispaddr = (uintptr_t)J2GG(as->J)->dispatch;
      uint8_t i8 = xo == XO_GROUP3b ? *as->mcp++ : 0;
      ra = RID_DISPATCH;
      if (checku32(dispaddr)) {
	emit_loadi(as, ra, (int32_t)dispaddr);
      } else {  /* Full-size 64 bit load. */
	MCode *p = as->mcp;
	*(uint64_t *)(p-8) = dispaddr;
	p[-9] = (MCode)(XI_MOVri+(ra&7));
	p[-10] = 0x48 + ((ra>>3)&1);
	p -= 10;
	as->mcp = p;
      }
      if (xo == XO_GROUP3b) emit_i8(as, i8);
    }
    emit_rmro(as, xo, rr, ra, 0);
    emit_loadu64(as, ra, (uintptr_t)addr);
  } else
#endif
  {
    MCode *p = as->mcp;
    *(int32_t *)(p-4) = ptr2addr(addr);
#if LJ_64
    p[-5] = MODRM(XM_SCALE1, RID_ESP, RID_EBP);
    as->mcp = emit_opm(xo, XM_OFS0, rr, RID_ESP, p, -5);
#else
    as->mcp = emit_opm(xo, XM_OFS0, rr, RID_EBP, p, -4);
#endif
  }
}